

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void downgradeAllSharedCacheTableLocks(Btree *p)

{
  BtShared *pBVar1;
  BtLock *pLock;
  BtShared *pBt;
  Btree *p_local;
  
  pBVar1 = p->pBt;
  if (pBVar1->pWriter == p) {
    pBVar1->pWriter = (Btree *)0x0;
    pBVar1->btsFlags = pBVar1->btsFlags & 0xff3f;
    for (pLock = pBVar1->pLock; pLock != (BtLock *)0x0; pLock = pLock->pNext) {
      pLock->eLock = '\x01';
    }
  }
  return;
}

Assistant:

static void downgradeAllSharedCacheTableLocks(Btree *p){
  BtShared *pBt = p->pBt;

  SHARED_LOCK_TRACE(pBt, "downgradeLocks", 0, 0);

  if( pBt->pWriter==p ){
    BtLock *pLock;
    pBt->pWriter = 0;
    pBt->btsFlags &= ~(BTS_EXCLUSIVE|BTS_PENDING);
    for(pLock=pBt->pLock; pLock; pLock=pLock->pNext){
      assert( pLock->eLock==READ_LOCK || pLock->pBtree==p );
      pLock->eLock = READ_LOCK;
    }
  }
}